

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeChangeToNoop(Vdbe *p,int addr)

{
  Op *__s;
  sqlite3 *db;
  VdbeOp *pOp;
  int addr_local;
  Vdbe *p_local;
  
  if (p->aOp != (Op *)0x0) {
    __s = p->aOp + addr;
    freeP4(p->db,(int)__s->p4type,(__s->p4).p);
    memset(__s,0,0x18);
    __s->opcode = 0x95;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeChangeToNoop(Vdbe *p, int addr){
  if( p->aOp ){
    VdbeOp *pOp = &p->aOp[addr];
    sqlite3 *db = p->db;
    freeP4(db, pOp->p4type, pOp->p4.p);
    memset(pOp, 0, sizeof(pOp[0]));
    pOp->opcode = OP_Noop;
  }
}